

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_helpers.h
# Opt level: O0

SCC * __thiscall google::protobuf::compiler::cpp::SCCAnalyzer::CreateSCC(SCCAnalyzer *this)

{
  SCC *this_00;
  reference ppSVar1;
  SCC *local_18;
  SCCAnalyzer *local_10;
  SCCAnalyzer *this_local;
  
  local_10 = this;
  this_00 = (SCC *)operator_new(0x18);
  memset(this_00,0,0x18);
  SCC::SCC(this_00);
  local_18 = this_00;
  std::
  vector<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
  ::push_back(&this->garbage_bin_,&local_18);
  ppSVar1 = std::
            vector<google::protobuf::compiler::cpp::SCC_*,_std::allocator<google::protobuf::compiler::cpp::SCC_*>_>
            ::back(&this->garbage_bin_);
  return *ppSVar1;
}

Assistant:

SCC* CreateSCC() {
    garbage_bin_.push_back(new SCC());
    return garbage_bin_.back();
  }